

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128l.cc
# Opt level: O3

int aead_aegis_128l_init(EVP_AEAD_CTX *ctx,uint8_t *key,size_t key_len,size_t tag_len)

{
  undefined8 uVar1;
  int reason;
  int line;
  
  if (key_len == 0x10) {
    if ((tag_len & 0xffffffffffffffef) == 0) {
      uVar1 = *(undefined8 *)(key + 8);
      (ctx->state).alignment = *(uint64_t *)key;
      *(undefined8 *)((long)&ctx->state + 8) = uVar1;
      ctx->tag_len = '\x10';
      return 1;
    }
    reason = 0x74;
    line = 0x5a;
  }
  else {
    reason = 0x66;
    line = 0x53;
  }
  ERR_put_error(0x1e,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128l.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_128l_init(EVP_AEAD_CTX *ctx, const uint8_t *key,
                                size_t key_len, size_t tag_len) {
  if (key_len != AEGIS_128L_KEY_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_KEY_LENGTH);
    return 0;
  }
  if (tag_len == EVP_AEAD_DEFAULT_TAG_LENGTH) {
    tag_len = AEGIS_128L_TAG_LEN;
  }
  if (tag_len != AEGIS_128L_TAG_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TAG_TOO_LARGE);
    return 0;
  }

  struct aead_aegis_128l_ctx *aegis_ctx =
      (struct aead_aegis_128l_ctx *)&ctx->state;
  OPENSSL_memcpy(aegis_ctx->key, key, key_len);
  ctx->tag_len = tag_len;

  return 1;
}